

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O0

int check_modalias(char *node_name)

{
  FILE *__stream;
  char *pcVar1;
  FILE *file;
  char buffer [255];
  char path [4096];
  char *node_name_local;
  
  memset(&file,0,0xff);
  snprintf(buffer + 0xf8,0x1000,"%s/%s/modalias","/sys/bus/platform/devices",node_name);
  __stream = fopen(buffer + 0xf8,"r");
  if (__stream == (FILE *)0x0) {
    node_name_local._4_4_ = 2;
  }
  else {
    fread(&file,1,0xff,__stream);
    fclose(__stream);
    pcVar1 = strstr((char *)&file,"nvidia");
    node_name_local._4_4_ = (uint)(pcVar1 == (char *)0x0);
  }
  return node_name_local._4_4_;
}

Assistant:

static int check_modalias(const char *node_name) {
	char path[PATH_MAX];
	char buffer[255] = { 0 };
	FILE *file;

	/* Check if the GPU is indeed made by NVIDIA by checking the compatibility
	 * field of the device tree, exposed to the userspace via modalias. As
	 * we are lazy, let's not parse the modalias string but just check if
	 * it mentions nvidia at all. If it does, return 0.
	 */

	snprintf(path, PATH_MAX, "%s/%s/modalias", PLATFORM_DEVICES_DIR, node_name);
	if (!(file = fopen(path, "r"))) {
		return 2;
	}
	fread(buffer, 1, sizeof(buffer), file);
	fclose(file);
	return strstr(buffer, "nvidia") == NULL;
}